

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmbiVector.h
# Opt level: O0

void __thiscall
Eigen::internal::AmbiVector<double,_int>::Iterator::Iterator
          (Iterator *this,AmbiVector<double,_int> *vec,RealScalar *epsilon)

{
  Scalar_conflict *pSVar1;
  bool bVar2;
  Iterator *pIVar3;
  double extraout_XMM0_Qa;
  ListEl *llElements;
  RealScalar *epsilon_local;
  AmbiVector<double,_int> *vec_local;
  Iterator *this_local;
  
  this->m_vector = vec;
  this->m_epsilon = *epsilon;
  this->m_isDense = this->m_vector->m_mode == 0;
  if ((this->m_isDense & 1U) == 0) {
    pSVar1 = this->m_vector->m_buffer;
    this->m_currentEl = this->m_vector->m_llStart;
    pIVar3 = this;
    while( true ) {
      bVar2 = false;
      if (-1 < this->m_currentEl) {
        std::abs((int)pIVar3);
        bVar2 = extraout_XMM0_Qa <= this->m_epsilon;
      }
      if (!bVar2) break;
      this->m_currentEl = *(Index *)(pSVar1 + (long)this->m_currentEl * 2);
    }
    if (this->m_currentEl < 0) {
      this->m_cachedValue = 0.0;
      this->m_cachedIndex = -1;
    }
    else {
      this->m_cachedIndex = *(Index *)((long)pSVar1 + (long)this->m_currentEl * 0x10 + 4);
      this->m_cachedValue = pSVar1[(long)this->m_currentEl * 2 + 1];
    }
  }
  else {
    this->m_currentEl = 0;
    this->m_cachedValue = 0.0;
    this->m_cachedIndex = this->m_vector->m_start + -1;
    operator++(this);
  }
  return;
}

Assistant:

Iterator(const AmbiVector& vec, const RealScalar& epsilon = 0)
      : m_vector(vec)
    {
      using std::abs;
      m_epsilon = epsilon;
      m_isDense = m_vector.m_mode==IsDense;
      if (m_isDense)
      {
        m_currentEl = 0;   // this is to avoid a compilation warning
        m_cachedValue = 0; // this is to avoid a compilation warning
        m_cachedIndex = m_vector.m_start-1;
        ++(*this);
      }
      else
      {
        ListEl* EIGEN_RESTRICT llElements = reinterpret_cast<ListEl*>(m_vector.m_buffer);
        m_currentEl = m_vector.m_llStart;
        while (m_currentEl>=0 && abs(llElements[m_currentEl].value)<=m_epsilon)
          m_currentEl = llElements[m_currentEl].next;
        if (m_currentEl<0)
        {
          m_cachedValue = 0; // this is to avoid a compilation warning
          m_cachedIndex = -1;
        }
        else
        {
          m_cachedIndex = llElements[m_currentEl].index;
          m_cachedValue = llElements[m_currentEl].value;
        }
      }
    }